

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mutexes.c
# Opt level: O0

int run_test_thread_rwlock_trylock(void)

{
  int iVar1;
  int64_t eval_b_10;
  int64_t eval_a_10;
  int64_t eval_b_9;
  int64_t eval_a_9;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uv_thread_t thread;
  
  iVar1 = uv_cond_init(&condvar);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-mutexes.c"
            ,0x8e,"uv_cond_init(&condvar)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_mutex_init(&mutex);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-mutexes.c"
            ,0x8f,"uv_mutex_init(&mutex)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_rwlock_init(&rwlock);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-mutexes.c"
            ,0x90,"uv_rwlock_init(&rwlock)","==","0",(long)iVar1,"==",0);
    abort();
  }
  uv_mutex_lock(&mutex);
  iVar1 = uv_thread_create((uv_thread_t *)&eval_a,thread_rwlock_trylock_peer,(void *)0x0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-mutexes.c"
            ,0x93,"uv_thread_create(&thread, thread_rwlock_trylock_peer, ((void*)0))","==","0",
            (long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_rwlock_trywrlock(&rwlock);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-mutexes.c"
            ,0x96,"uv_rwlock_trywrlock(&rwlock)","==","0",(long)iVar1,"==",0);
    abort();
  }
  synchronize();
  uv_rwlock_wrunlock(&rwlock);
  iVar1 = uv_rwlock_tryrdlock(&rwlock);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-mutexes.c"
            ,0x9d,"uv_rwlock_tryrdlock(&rwlock)","==","0",(long)iVar1,"==",0);
    abort();
  }
  synchronize();
  uv_rwlock_rdunlock(&rwlock);
  synchronize();
  iVar1 = uv_rwlock_tryrdlock(&rwlock);
  if ((long)iVar1 != -0x10) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-mutexes.c"
            ,0xa5,"UV_EBUSY","==","uv_rwlock_tryrdlock(&rwlock)",0xfffffffffffffff0,"==",(long)iVar1
           );
    abort();
  }
  iVar1 = uv_rwlock_trywrlock(&rwlock);
  if ((long)iVar1 != -0x10) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-mutexes.c"
            ,0xa6,"UV_EBUSY","==","uv_rwlock_trywrlock(&rwlock)",0xfffffffffffffff0,"==",(long)iVar1
           );
    abort();
  }
  synchronize();
  iVar1 = uv_rwlock_tryrdlock(&rwlock);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-mutexes.c"
            ,0xaa,"uv_rwlock_tryrdlock(&rwlock)","==","0",(long)iVar1,"==",0);
    abort();
  }
  uv_rwlock_rdunlock(&rwlock);
  iVar1 = uv_rwlock_trywrlock(&rwlock);
  if ((long)iVar1 != -0x10) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-mutexes.c"
            ,0xac,"UV_EBUSY","==","uv_rwlock_trywrlock(&rwlock)",0xfffffffffffffff0,"==",(long)iVar1
           );
    abort();
  }
  synchronize();
  iVar1 = uv_thread_join((uv_thread_t *)&eval_a);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-mutexes.c"
            ,0xaf,"uv_thread_join(&thread)","==","0",(long)iVar1,"==",0);
    abort();
  }
  uv_rwlock_destroy(&rwlock);
  uv_mutex_unlock(&mutex);
  uv_mutex_destroy(&mutex);
  uv_cond_destroy(&condvar);
  return 0;
}

Assistant:

TEST_IMPL(thread_rwlock_trylock) {
  uv_thread_t thread;

  ASSERT_OK(uv_cond_init(&condvar));
  ASSERT_OK(uv_mutex_init(&mutex));
  ASSERT_OK(uv_rwlock_init(&rwlock));

  uv_mutex_lock(&mutex);
  ASSERT_OK(uv_thread_create(&thread, thread_rwlock_trylock_peer, NULL));

  /* Hold write lock. */
  ASSERT_OK(uv_rwlock_trywrlock(&rwlock));
  synchronize();  /* Releases the mutex to the other thread. */

  /* Release write lock and acquire read lock.  Pthreads doesn't support
   * the notion of upgrading or downgrading rwlocks, so neither do we.
   */
  uv_rwlock_wrunlock(&rwlock);
  ASSERT_OK(uv_rwlock_tryrdlock(&rwlock));
  synchronize();

  /* Release read lock. */
  uv_rwlock_rdunlock(&rwlock);
  synchronize();

  /* Write lock held by other thread. */
  ASSERT_EQ(UV_EBUSY, uv_rwlock_tryrdlock(&rwlock));
  ASSERT_EQ(UV_EBUSY, uv_rwlock_trywrlock(&rwlock));
  synchronize();

  /* Read lock held by other thread. */
  ASSERT_OK(uv_rwlock_tryrdlock(&rwlock));
  uv_rwlock_rdunlock(&rwlock);
  ASSERT_EQ(UV_EBUSY, uv_rwlock_trywrlock(&rwlock));
  synchronize();

  ASSERT_OK(uv_thread_join(&thread));
  uv_rwlock_destroy(&rwlock);
  uv_mutex_unlock(&mutex);
  uv_mutex_destroy(&mutex);
  uv_cond_destroy(&condvar);

  return 0;
}